

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_get_v3i(exr_const_context_t_conflict ctxt,int part_index,char *name,exr_attr_v3i_t *out)

{
  undefined8 *puVar1;
  undefined8 *in_RCX;
  exr_attribute_t **in_RDX;
  int in_ESI;
  exr_attribute_list_t *in_RDI;
  exr_const_priv_part_t part;
  exr_result_t rv;
  exr_attribute_t *attr;
  exr_const_context_t_conflict in_stack_ffffffffffffffc0;
  exr_const_context_t_conflict c;
  long local_30;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar2;
  
  if (in_RDI == (exr_attribute_list_t *)0x0) {
    eVar2 = 2;
  }
  else {
    if ((char)in_RDI->num_attributes == '\x01') {
      internal_exr_lock(in_stack_ffffffffffffffc0);
    }
    if ((in_ESI < 0) || (in_RDI[8].num_alloced <= in_ESI)) {
      if ((char)in_RDI->num_attributes == '\x01') {
        internal_exr_unlock(in_stack_ffffffffffffffc0);
      }
      eVar2 = (**(code **)(in_RDI + 3))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      c = (exr_const_context_t_conflict)in_RDI[0x13].sorted_entries[in_ESI];
      if ((in_RDX == (exr_attribute_t **)0x0) || (*(char *)in_RDX == '\0')) {
        if ((char)in_RDI->num_attributes == '\x01') {
          internal_exr_unlock(c);
        }
        eVar2 = (*(code *)in_RDI[2].sorted_entries)(in_RDI,3,"Invalid name for v3i attribute query")
        ;
      }
      else {
        eVar2 = exr_attr_list_find_by_name
                          ((exr_const_context_t_conflict)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
        if (eVar2 == 0) {
          if (*(int *)(local_30 + 0x14) == 0x1a) {
            if (in_RCX == (undefined8 *)0x0) {
              if ((char)in_RDI->num_attributes == '\x01') {
                internal_exr_unlock(c);
              }
              eVar2 = (**(code **)(in_RDI + 3))(in_RDI,3,"NULL output for \'%s\'",in_RDX);
            }
            else {
              puVar1 = *(undefined8 **)(local_30 + 0x18);
              *in_RCX = *puVar1;
              *(undefined4 *)(in_RCX + 1) = *(undefined4 *)(puVar1 + 1);
              if ((char)in_RDI->num_attributes == '\x01') {
                internal_exr_unlock(c);
              }
            }
          }
          else {
            if ((char)in_RDI->num_attributes == '\x01') {
              internal_exr_unlock(c);
            }
            eVar2 = (**(code **)(in_RDI + 3))
                              (in_RDI,0x10,
                               "\'%s\' requested type \'v3i\', but stored attributes is type \'%s\'"
                               ,in_RDX,*(undefined8 *)(local_30 + 8));
          }
        }
        else if ((char)in_RDI->num_attributes == '\x01') {
          internal_exr_unlock(c);
        }
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_get_v3i (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    exr_attr_v3i_t*     out)
{
    ATTR_GET_IMPL_DEREF (EXR_ATTR_V3I, v3i);
}